

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

LockedHandle<perfetto::TrackEvent> * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetDataSourceLocked
          (LockedHandle<perfetto::TrackEvent> *__return_storage_ptr__,TraceContext *this)

{
  uint uVar1;
  TrackEvent *pTVar2;
  mutex_type *pmVar3;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_40;
  unique_lock<std::recursive_mutex> local_30;
  
  uVar1 = this->instance_index_;
  if (((uint)static_state_.valid_instances.super___atomic_base<unsigned_int>._M_i >> (uVar1 & 0x1f)
      & 1) == 0) {
    (__return_storage_ptr__->lock_)._M_device = (mutex_type *)0x0;
    *(undefined8 *)&(__return_storage_ptr__->lock_)._M_owns = 0;
    __return_storage_ptr__->obj_ = (TrackEvent *)0x0;
  }
  else {
    local_30._M_device = (mutex_type *)(static_state_.instances._M_elems[uVar1].storage + 0x38);
    local_30._M_owns = false;
    ::std::unique_lock<std::recursive_mutex>::lock(&local_30);
    pmVar3 = local_30._M_device;
    local_30._M_device = (mutex_type *)0x0;
    local_30._M_owns = false;
    pTVar2 = *(TrackEvent **)(static_state_.instances._M_elems[uVar1].storage + 0x60);
    (__return_storage_ptr__->lock_)._M_device = pmVar3;
    (__return_storage_ptr__->lock_)._M_owns = true;
    local_40._M_device = (mutex_type *)0x0;
    local_40._M_owns = false;
    __return_storage_ptr__->obj_ = pTVar2;
    ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
    ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

LockedHandle<DataSourceType> GetDataSourceLocked() const {
      auto* internal_state = static_state_.TryGet(instance_index_);
      if (!internal_state)
        return LockedHandle<DataSourceType>();
      std::unique_lock<std::recursive_mutex> lock(internal_state->lock);
      return LockedHandle<DataSourceType>(
          std::move(lock),
          static_cast<DataSourceType*>(internal_state->data_source.get()));
    }